

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O2

_Bool key_is_valid(ext_key *hdkey)

{
  uint8_t uVar1;
  byte bVar2;
  _Bool _Var3;
  
  uVar1 = hdkey->depth;
  bVar2 = hdkey->priv_key[0];
  _Var3 = version_is_valid(hdkey->version,(uint)(bVar2 != 0));
  if (((_Var3) && (_Var3 = mem_is_zero(hdkey,0x20), !_Var3)) && ((hdkey->pub_key[0] & 0xfe) == 2)) {
    _Var3 = mem_is_zero(hdkey->pub_key + 1,0x20);
    if (1 < bVar2) {
      return false;
    }
    if (_Var3) {
      return false;
    }
    if (((bVar2 != 0) || (_Var3 = mem_is_zero(hdkey->priv_key + 1,0x20), !_Var3)) &&
       ((uVar1 != '\0' || (_Var3 = mem_is_zero(hdkey->parent160,0x14), _Var3)))) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool key_is_valid(const struct ext_key *hdkey)
{
    bool is_private = key_is_private(hdkey);
    bool is_master = !hdkey->depth;
    uint8_t ver_flags = is_private ? BIP32_FLAG_KEY_PRIVATE : BIP32_FLAG_KEY_PUBLIC;

    if (!version_is_valid(hdkey->version, ver_flags))
        return false;

    if (mem_is_zero(hdkey->chain_code, sizeof(hdkey->chain_code)) ||
        (hdkey->pub_key[0] != 0x2 && hdkey->pub_key[0] != 0x3) ||
        mem_is_zero(hdkey->pub_key + 1, sizeof(hdkey->pub_key) - 1))
        return false;

    if (hdkey->priv_key[0] != BIP32_FLAG_KEY_PUBLIC &&
        hdkey->priv_key[0] != BIP32_FLAG_KEY_PRIVATE)
        return false;

    if (is_private &&
        mem_is_zero(hdkey->priv_key + 1, sizeof(hdkey->priv_key) - 1))
        return false;

    if (is_master &&
        !mem_is_zero(hdkey->parent160, sizeof(hdkey->parent160)))
        return false;

    return true;
}